

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void template_conform(t_template *tfrom,t_template *tto)

{
  t_dataslot *ptVar1;
  size_t nbytes;
  uint uVar2;
  uint uVar3;
  int iVar4;
  t_dataslot *ptVar5;
  t_symbol *ptVar6;
  bool bVar7;
  int *conformaction;
  void *__s;
  ulong uVar8;
  _glist *glist;
  ulong uVar9;
  long lVar10;
  t_symbol **pptVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar2 = tto->t_n;
  uVar13 = (ulong)(int)uVar2;
  uVar3 = tfrom->t_n;
  nbytes = uVar13 * 4;
  conformaction = (int *)getbytes(nbytes);
  __s = getbytes((long)(int)uVar3 * 4);
  uVar8 = (ulong)uVar3;
  if (0 < (long)uVar13) {
    memset(conformaction,0xff,nbytes);
  }
  if (0 < (int)uVar3) {
    memset(__s,0,uVar8 * 4);
  }
  if (0 < (int)uVar2) {
    ptVar5 = tto->t_vec;
    uVar9 = 0;
    do {
      if (0 < (int)uVar3) {
        ptVar1 = ptVar5 + uVar9;
        ptVar6 = ptVar1->ds_name;
        pptVar11 = &tfrom->t_vec->ds_arraytemplate;
        uVar12 = 0;
        do {
          if (((ptVar6 == pptVar11[-1]) &&
              (ptVar1->ds_type == ((t_dataslot *)(pptVar11 + -2))->ds_type)) &&
             ((ptVar1->ds_type != 3 || (ptVar1->ds_arraytemplate == *pptVar11)))) {
            conformaction[uVar9] = (int)uVar12;
            *(undefined4 *)((long)__s + uVar12 * 4) = 1;
          }
          uVar12 = uVar12 + 1;
          pptVar11 = pptVar11 + 3;
        } while (uVar8 != uVar12);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar13);
  }
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      if ((conformaction[uVar9] < 0) && (0 < (int)uVar3)) {
        ptVar5 = tto->t_vec;
        lVar10 = 0x10;
        uVar12 = 0;
        do {
          if (*(int *)((long)__s + uVar12 * 4) == 0) {
            iVar4 = ptVar5[uVar9].ds_type;
            if ((iVar4 == *(int *)((long)tfrom->t_vec + lVar10 + -0x10)) &&
               ((iVar4 != 3 ||
                (ptVar5[uVar9].ds_arraytemplate ==
                 *(t_symbol **)((long)&tfrom->t_vec->ds_type + lVar10))))) {
              conformaction[uVar9] = (int)uVar12;
              *(undefined4 *)((long)__s + uVar12 * 4) = 1;
            }
          }
          uVar12 = uVar12 + 1;
          lVar10 = lVar10 + 0x18;
        } while (uVar8 != uVar12);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar13);
  }
  if (uVar2 == uVar3) {
    if ((int)uVar2 < 1) goto LAB_00158614;
    uVar8 = 0;
    bVar7 = false;
    do {
      if (uVar8 != (uint)conformaction[uVar8]) {
        bVar7 = true;
      }
      uVar8 = uVar8 + 1;
    } while (uVar13 != uVar8);
    if (!bVar7) goto LAB_00158614;
  }
  for (glist = pd_getcanvaslist(); glist != (_glist *)0x0; glist = glist->gl_next) {
    template_conformglist(tfrom,tto,glist,conformaction);
  }
LAB_00158614:
  freebytes(conformaction,nbytes);
  freebytes(__s,(long)(int)uVar3 * 4);
  return;
}

Assistant:

void template_conform(t_template *tfrom, t_template *tto)
{
    int nto = tto->t_n, nfrom = tfrom->t_n, i, j,
        *conformaction = (int *)getbytes(sizeof(int) * nto),
        *conformedfrom = (int *)getbytes(sizeof(int) * nfrom), doit = 0;
    for (i = 0; i < nto; i++)
        conformaction[i] = -1;
    for (i = 0; i < nfrom; i++)
        conformedfrom[i] = 0;
    for (i = 0; i < nto; i++)
    {
        t_dataslot *dataslot = &tto->t_vec[i];
        for (j = 0; j < nfrom; j++)
        {
            t_dataslot *dataslot2 = &tfrom->t_vec[j];
            if (dataslot_matches(dataslot, dataslot2, 1))
            {
                conformaction[i] = j;
                conformedfrom[j] = 1;
            }
        }
    }
    for (i = 0; i < nto; i++)
        if (conformaction[i] < 0)
    {
        t_dataslot *dataslot = &tto->t_vec[i];
        for (j = 0; j < nfrom; j++)
            if (!conformedfrom[j] &&
                dataslot_matches(dataslot, &tfrom->t_vec[j], 0))
        {
            conformaction[i] = j;
            conformedfrom[j] = 1;
        }
    }
    if (nto != nfrom)
        doit = 1;
    else for (i = 0; i < nto; i++)
        if (conformaction[i] != i)
            doit = 1;

    if (doit)
    {
        t_glist *gl;
        for (gl = pd_getcanvaslist(); gl; gl = gl->gl_next)
            template_conformglist(tfrom, tto, gl, conformaction);
    }
    freebytes(conformaction, sizeof(int) * nto);
    freebytes(conformedfrom, sizeof(int) * nfrom);
}